

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::SolveBeforeConstraint::fromSyntax
          (SolveBeforeConstraintSyntax *syntax,ASTContext *context)

{
  int iVar1;
  Compilation *dst;
  undefined4 extraout_var;
  SolveBeforeConstraint *pSVar2;
  EVP_PKEY_CTX *src;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *src_00;
  SolveBeforeConstraint *result;
  SmallVector<const_slang::ast::Expression_*,_5UL> after;
  SmallVector<const_slang::ast::Expression_*,_5UL> solve;
  Compilation *comp;
  anon_class_16_2_80a99c9f bindExprs;
  bool bad;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_1;
  BumpAllocator *this;
  SmallVectorBase<const_slang::ast::Expression_*> local_b8;
  SmallVector<const_slang::ast::Expression_*,_5UL> *in_stack_ffffffffffffff80;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_ffffffffffffff88;
  anon_class_16_2_80a99c9f *in_stack_ffffffffffffff90;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *args;
  
  dst = ASTContext::getCompilation((ASTContext *)0x6d299c);
  this = (BumpAllocator *)&stack0xffffffffffffff88;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x6d29b6);
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x6d29c3);
  fromSyntax(slang::syntax::SolveBeforeConstraintSyntax_const&,slang::ast::ASTContext_const&)::$_0::
  operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  fromSyntax(slang::syntax::SolveBeforeConstraintSyntax_const&,slang::ast::ASTContext_const&)::$_0::
  operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iVar1 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)&stack0xffffffffffffff88,
                     (EVP_PKEY_CTX *)dst,src);
  args = (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)
         CONCAT44(extraout_var,iVar1);
  args_1 = src_00;
  SmallVectorBase<const_slang::ast::Expression_*>::copy
            (&local_b8,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src_00);
  pSVar2 = BumpAllocator::
           emplace<slang::ast::SolveBeforeConstraint,std::span<slang::ast::Expression_const*,18446744073709551615ul>,std::span<slang::ast::Expression_const*,18446744073709551615ul>>
                     (this,args,args_1);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x6d2b1e);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x6d2b2b);
  return &pSVar2->super_Constraint;
}

Assistant:

Constraint& SolveBeforeConstraint::fromSyntax(const SolveBeforeConstraintSyntax& syntax,
                                              const ASTContext& context) {
    bool bad = false;
    auto bindExprs = [&](auto& list, auto& results) {
        for (auto item : list) {
            auto& expr = Expression::bind(*item, context);
            results.push_back(&expr);

            if (expr.bad()) {
                bad = true;
                continue;
            }

            auto [sym, sourceRange] = getConstraintPrimary(expr);
            if (!sym || context.getRandMode(*sym) == RandMode::None)
                context.addDiag(diag::BadSolveBefore, sourceRange);
            else if (sym && context.getRandMode(*sym) == RandMode::RandC)
                context.addDiag(diag::RandCInSolveBefore, sourceRange);
        }
    };

    auto& comp = context.getCompilation();
    SmallVector<const Expression*> solve;
    SmallVector<const Expression*> after;
    bindExprs(syntax.beforeExpr, solve);
    bindExprs(syntax.afterExpr, after);

    auto result = comp.emplace<SolveBeforeConstraint>(solve.copy(comp), after.copy(comp));
    if (bad)
        return badConstraint(comp, result);

    return *result;
}